

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

int polymul::polynomial<double,_3,_6>::term_index(int *exponents)

{
  int i;
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int nvar;
  
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar3 = iVar3 + exponents[lVar2];
  }
  iVar4 = 0;
  nvar = 3;
  for (iVar3 = iVar3 + -1; -1 < iVar3; iVar3 = iVar3 - iVar1) {
    iVar1 = polylen(nvar,iVar3);
    iVar4 = iVar4 + iVar1;
    iVar1 = *exponents;
    nvar = nvar + -1;
    exponents = exponents + 1;
  }
  return iVar4;
}

Assistant:

static int term_index(const int exponents[Nvar]) {
    int N = 0;
    for (int i = 0; i < Nvar; i++)
      N += exponents[i];
    int i = 0, idx = 0;
    N--;
    while (N >= 0) {
      idx += polylen(Nvar - i, N);
      N -= exponents[i];
      i++;
    }
    return idx;
  }